

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void ArrangeScriptProfiles(TArray<ProfileCollector,_ProfileCollector> *profiles)

{
  uint uVar1;
  FBehavior *pFVar2;
  ScriptPtr *pSVar3;
  ProfileCollector *pPVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  if (FBehavior::StaticModules.Count != 0) {
    uVar7 = 0;
    do {
      pFVar2 = FBehavior::StaticModules.Array[uVar7];
      if (0 < pFVar2->NumScripts) {
        lVar5 = 0x20;
        lVar6 = 0;
        do {
          pSVar3 = pFVar2->Scripts;
          TArray<ProfileCollector,_ProfileCollector>::Grow(profiles,1);
          pPVar4 = profiles->Array;
          uVar1 = profiles->Count;
          pPVar4[uVar1].ProfileData = (ACSProfileInfo *)((long)&pSVar3->Number + lVar5);
          pPVar4[uVar1].Module = pFVar2;
          pPVar4[uVar1].Index = (int)lVar6;
          profiles->Count = profiles->Count + 1;
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x38;
        } while (lVar6 < pFVar2->NumScripts);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < FBehavior::StaticModules.Count);
  }
  return;
}

Assistant:

void ArrangeScriptProfiles(TArray<ProfileCollector> &profiles)
{
	for (unsigned int mod_num = 0; mod_num < FBehavior::StaticModules.Size(); ++mod_num)
	{
		FBehavior *module = FBehavior::StaticModules[mod_num];
		ProfileCollector prof;
		prof.Module = module;
		for (int i = 0; i < module->NumScripts; ++i)
		{
			prof.Index = i;
			prof.ProfileData = &module->Scripts[i].ProfileData;
			profiles.Push(prof);
		}
	}
}